

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::negF64x2(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  Literal *this_00;
  Literal local_78;
  undefined1 local_60 [8];
  LaneArray<2> lanes;
  
  getLanesF64x2((LaneArray<2> *)local_60,this);
  this_00 = (Literal *)local_60;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    neg(&local_78,this_00);
    ~Literal(this_00);
    Literal(this_00,&local_78);
    ~Literal(&local_78);
    this_00 = (Literal *)&lanes._M_elems[0].type;
    bVar1 = false;
  } while (bVar2);
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_60);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_60 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::negF64x2() const {
  return unary<2, &Literal::getLanesF64x2, &Literal::neg>(*this);
}